

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::ModifyRepeatedFields<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  TestAllTypes *pTVar1;
  TestAllTypes_RepeatedGroup *this;
  TestAllTypes_NestedMessage *pTVar2;
  ForeignMessage *this_00;
  ImportMessage *this_01;
  Reflection *pRVar3;
  Descriptor *pDVar4;
  FieldDescriptor *pFVar5;
  allocator<char> local_89;
  string local_88;
  string_view local_68 [2];
  allocator<char> local_41;
  string local_40;
  string_view local_20;
  TestAllTypes *local_10;
  TestAllTypes *message_local;
  
  local_10 = message;
  proto2_unittest::TestAllTypes::set_repeated_int32(message,1,0x1f5);
  proto2_unittest::TestAllTypes::set_repeated_int64(local_10,1,0x1f6);
  proto2_unittest::TestAllTypes::set_repeated_uint32(local_10,1,0x1f7);
  proto2_unittest::TestAllTypes::set_repeated_uint64(local_10,1,0x1f8);
  proto2_unittest::TestAllTypes::set_repeated_sint32(local_10,1,0x1f9);
  proto2_unittest::TestAllTypes::set_repeated_sint64(local_10,1,0x1fa);
  proto2_unittest::TestAllTypes::set_repeated_fixed32(local_10,1,0x1fb);
  proto2_unittest::TestAllTypes::set_repeated_fixed64(local_10,1,0x1fc);
  proto2_unittest::TestAllTypes::set_repeated_sfixed32(local_10,1,0x1fd);
  proto2_unittest::TestAllTypes::set_repeated_sfixed64(local_10,1,0x1fe);
  proto2_unittest::TestAllTypes::set_repeated_float(local_10,1,511.0);
  proto2_unittest::TestAllTypes::set_repeated_double(local_10,1,512.0);
  proto2_unittest::TestAllTypes::set_repeated_bool(local_10,1,true);
  proto2_unittest::TestAllTypes::set_repeated_string<char_const(&)[4]>
            (local_10,1,(char (*) [4])"515");
  proto2_unittest::TestAllTypes::set_repeated_bytes<char_const(&)[4]>
            (local_10,1,(char (*) [4])"516");
  this = proto2_unittest::TestAllTypes::mutable_repeatedgroup(local_10,1);
  proto2_unittest::TestAllTypes_RepeatedGroup::set_a(this,0x205);
  pTVar2 = proto2_unittest::TestAllTypes::mutable_repeated_nested_message(local_10,1);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar2,0x206);
  this_00 = proto2_unittest::TestAllTypes::mutable_repeated_foreign_message(local_10,1);
  proto2_unittest::ForeignMessage::set_c(this_00,0x207);
  this_01 = proto2_unittest::TestAllTypes::mutable_repeated_import_message(local_10,1);
  proto2_unittest_import::ImportMessage::set_d(this_01,0x208);
  pTVar2 = proto2_unittest::TestAllTypes::mutable_repeated_lazy_message(local_10,1);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar2,0x20f);
  proto2_unittest::TestAllTypes::set_repeated_nested_enum(local_10,1,TestAllTypes_NestedEnum_FOO);
  proto2_unittest::TestAllTypes::set_repeated_foreign_enum(local_10,1,FOREIGN_FOO);
  proto2_unittest::TestAllTypes::set_repeated_import_enum(local_10,1,IMPORT_FOO);
  pRVar3 = proto2_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_10;
  pDVar4 = proto2_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"repeated_string_piece");
  pFVar5 = Descriptor::FindFieldByName(pDVar4,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"524",&local_41);
  Reflection::SetRepeatedString(pRVar3,&pTVar1->super_Message,pFVar5,1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pRVar3 = proto2_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_10;
  pDVar4 = proto2_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_68,"repeated_cord")
  ;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,local_68[0]);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"525",&local_89);
  Reflection::SetRepeatedString(pRVar3,&pTVar1->super_Message,pFVar5,1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

void ModifyRepeatedFields(TestAllTypes* message) {
  message->set_repeated_int32(1, 501);
  message->set_repeated_int64(1, 502);
  message->set_repeated_uint32(1, 503);
  message->set_repeated_uint64(1, 504);
  message->set_repeated_sint32(1, 505);
  message->set_repeated_sint64(1, 506);
  message->set_repeated_fixed32(1, 507);
  message->set_repeated_fixed64(1, 508);
  message->set_repeated_sfixed32(1, 509);
  message->set_repeated_sfixed64(1, 510);
  message->set_repeated_float(1, 511);
  message->set_repeated_double(1, 512);
  message->set_repeated_bool(1, true);
  message->set_repeated_string(1, "515");
  message->set_repeated_bytes(1, "516");

  message->mutable_repeatedgroup(1)->set_a(517);
  message->mutable_repeated_nested_message(1)->set_bb(518);
  message->mutable_repeated_foreign_message(1)->set_c(519);
  message->mutable_repeated_import_message(1)->set_d(520);
  message->mutable_repeated_lazy_message(1)->set_bb(527);

  message->set_repeated_nested_enum(1, TestAllTypes::FOO);
  message->set_repeated_foreign_enum(1, ForeignEnum<TestAllTypes>::FOREIGN_FOO);
  message->set_repeated_import_enum(1, ImportEnum<TestAllTypes>::IMPORT_FOO);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->SetRepeatedString(
      message,
      message->GetDescriptor()->FindFieldByName("repeated_string_piece"), 1,
      "524");
  message->GetReflection()->SetRepeatedString(
      message, message->GetDescriptor()->FindFieldByName("repeated_cord"), 1,
      "525");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}